

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.h
# Opt level: O0

void __thiscall compose::TreeNode::~TreeNode(TreeNode *this)

{
  TreeNode *this_local;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR_AddNode_0019e770;
  std::vector<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>::
  ~vector(&this->nodes_);
  INode::~INode(&this->super_INode);
  return;
}

Assistant:

TreeNode::~TreeNode() {}